

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Execute<duckdb::hugeint_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::hugeint_t,duckdb::string_t>>
               (ArgMinMaxState<duckdb::hugeint_t,_duckdb::string_t> *state,hugeint_t x_data,
               string_t y_data,AggregateBinaryInput *binary)

{
  unsigned_long *puVar1;
  bool bVar2;
  string_t *psVar3;
  string_t new_value;
  anon_union_16_2_67f50693_for_value local_38;
  
  local_38.pointer.ptr = (char *)y_data.value._8_8_;
  local_38._0_8_ = y_data.value._0_8_;
  puVar1 = (binary->right_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  psVar3 = (string_t *)local_38._0_8_;
  if ((puVar1 != (unsigned_long *)0x0) &&
     (psVar3 = (string_t *)binary->ridx,
     (puVar1[(ulong)psVar3 >> 6] >> ((ulong)psVar3 & 0x3f) & 1) == 0)) {
    return;
  }
  bVar2 = string_t::StringComparisonOperators::GreaterThan
                    (&state->value,(string_t *)&local_38.pointer);
  if (!bVar2) {
    return;
  }
  puVar1 = (binary->left_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    (state->super_ArgMinMaxStateBase).arg_null = false;
  }
  else {
    psVar3 = (string_t *)binary->lidx;
    bVar2 = (puVar1[(ulong)psVar3 >> 6] >> ((ulong)psVar3 & 0x3f) & 1) == 0;
    (state->super_ArgMinMaxStateBase).arg_null = bVar2;
    if (bVar2) goto LAB_0187eca0;
  }
  (state->arg).lower = x_data.lower;
  (state->arg).upper = x_data.upper;
LAB_0187eca0:
  new_value.value.pointer.ptr = (char *)psVar3;
  new_value.value._0_8_ = local_38.pointer.ptr;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)&state->value,(string_t *)local_38._0_8_,new_value);
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}